

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamtests.cc
# Opt level: O1

int main(int argc,char **argv)

{
  char *__s;
  char *pcVar1;
  bool bVar2;
  int iVar3;
  UnitTest *this;
  ostream *poVar4;
  size_t sVar5;
  int iVar6;
  stat info;
  char local_b5;
  int local_b4;
  stat local_b0;
  
  local_b4 = argc;
  testing::InitGoogleTest(&local_b4,argv);
  pcVar1 = DAT_001545e8;
  if (testing::FLAGS_gtest_list_tests != '\0') goto LAB_00109a0b;
  if (local_b4 != 2) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Usage: ",7);
    pcVar1 = *argv;
    if (pcVar1 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x1555f8);
    }
    else {
      sVar5 = strlen(pcVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar1,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," <test images path>\n",0x14);
    return -1;
  }
  __s = argv[1];
  strlen(__s);
  iVar6 = 0;
  std::__cxx11::string::_M_replace(0x1545e0,0,pcVar1,(ulong)__s);
  iVar3 = stat((anonymous_namespace)::testImagesPath_abi_cxx11_,&local_b0);
  if (iVar3 == 0) {
    bVar2 = true;
    if ((local_b0.st_mode._1_1_ & 0x40) == 0) {
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(anonymous_namespace)::testImagesPath_abi_cxx11_,
                          (long)DAT_001545e8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"is not a valid directory\n",0x19);
      iVar6 = -3;
      goto LAB_00109b3a;
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Cannot access ",0xe);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(anonymous_namespace)::testImagesPath_abi_cxx11_,
                        (long)DAT_001545e8);
    local_b5 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_b5,1);
    iVar6 = -2;
LAB_00109b3a:
    bVar2 = false;
  }
  if (!bVar2) {
    return iVar6;
  }
LAB_00109a0b:
  this = testing::UnitTest::GetInstance();
  iVar3 = testing::UnitTest::Run(this);
  return iVar3;
}

Assistant:

int main(int argc, char **argv)
{
    ::testing::InitGoogleTest(&argc, argv);

    if (!::testing::FLAGS_gtest_list_tests)
    {
        if (argc != 2)
        {
            std::cerr << "Usage: " << argv[0] << " <test images path>\n";
            return -1;
        }

        testImagesPath = argv[1];

        struct stat info;
        if (stat(testImagesPath.data(), &info) != 0)
        {
            std::cerr << "Cannot access " << testImagesPath << '\n';
            return -2;
        }
        else if (!(info.st_mode & S_IFDIR))
        {
            std::cerr << testImagesPath << "is not a valid directory\n";
            return -3;
        }
    }

    return RUN_ALL_TESTS();
}